

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O0

void Vec_WecFree(Vec_Wec_t *p)

{
  Vec_Wec_t *p_local;
  
  Vec_WecErase(p);
  if (p != (Vec_Wec_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

static inline void Vec_WecFree( Vec_Wec_t * p )
{
    Vec_WecErase( p );
    ABC_FREE( p );
}